

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O0

void control_loop(void)

{
  int iVar1;
  OdometryPtr odm;
  SpurUserParamsPtr spur_00;
  long lVar2;
  OdometryPtr p_Var3;
  double *pdVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  double adStack_388 [79];
  SpurUserParamsPtr local_110;
  double local_108;
  double local_100;
  double dt_error;
  double dt;
  double now;
  double expected_dt;
  double current_monotonic_time;
  timespec current;
  double control_cycle;
  double last_monotonic_time;
  timespec request;
  double last_time;
  int __not_first_call;
  void *__cancel_arg;
  _func_void_void_ptr *__cancel_routine;
  __pthread_unwind_buf_t __cancel_buf;
  SpurUserParamsPtr spur;
  OdometryPtr odometry;
  
  bVar5 = 0;
  odm = get_odometry_ptr();
  spur_00 = get_spur_user_param_ptr();
  yprintf(OUTPUT_LV_INFO,"Trajectory control loop started.\n");
  iVar1 = __sigsetjmp(&__cancel_routine,0);
  if (iVar1 != 0) {
    control_loop_cleanup((void *)0x0);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_routine);
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_routine);
  request.tv_nsec = (__syscall_slong_t)get_time();
  iVar1 = clock_gettime(1,(timespec *)&last_monotonic_time);
  if (iVar1 == -1) {
    yprintf(OUTPUT_LV_ERROR,"Error on clock_gettime\n");
    pthread_exit(&control_loop::status);
  }
  control_cycle = (double)(long)last_monotonic_time + (double)request.tv_sec / 1000000000.0;
  do {
    current.tv_nsec = (__syscall_slong_t)p(YP_PARAM_CONTROL_CYCLE,MOTOR_RIGHT);
    lVar2 = (long)((double)current.tv_nsec * 1000000000.0 + (double)request.tv_sec);
    last_monotonic_time = (double)(lVar2 / 1000000000 + (long)last_monotonic_time);
    request.tv_sec = lVar2 % 1000000000;
    clock_nanosleep(1,1,(timespec *)&last_monotonic_time,(timespec *)0x0);
    iVar1 = clock_gettime(1,(timespec *)&current_monotonic_time);
    if (iVar1 == -1) {
      yprintf(OUTPUT_LV_ERROR,"Error on clock_gettime\n");
      pthread_exit(&control_loop::status_1);
    }
    dVar6 = (double)(long)current_monotonic_time + (double)current.tv_sec / 1000000000.0;
    now = dVar6 - control_cycle;
    expected_dt = dVar6;
    iVar1 = option(OPTION_EXIT_ON_TIME_JUMP);
    if (iVar1 != 0) {
      dt = get_time();
      dt_error = dt - (double)request.tv_nsec;
      local_100 = dt_error - now;
      request.tv_nsec = (__syscall_slong_t)dt;
      if (dt_error < 0.0) {
        yprintf(OUTPUT_LV_ERROR,
                "Detected system time jump back, monotonic time diff: %0.5fs, system time diff: %0.5fs\n"
                ,now,dt_error);
        pthread_exit(&control_loop::status_2);
      }
      local_108 = local_100;
      dVar7 = p(YP_PARAM_MAX_TIME_JUMP_NEG,MOTOR_RIGHT);
      if ((local_108 < -dVar7) || (dVar7 = p(YP_PARAM_MAX_TIME_JUMP,MOTOR_RIGHT), dVar7 < local_100)
         ) {
        yprintf(OUTPUT_LV_ERROR,
                "Detected system time jump: %0.5fs, monotonic time diff: %0.5fs, system time diff: %0.5fs\n"
                ,local_100,now,dt_error);
        pthread_exit(&control_loop::status_3);
      }
    }
    coordinate_synchronize(odm,spur_00);
    p_Var3 = odm;
    pdVar4 = adStack_388;
    local_110 = spur_00;
    for (lVar2 = 0x4e; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pdVar4 = p_Var3->x;
      p_Var3 = (OdometryPtr)((long)p_Var3 + (ulong)bVar5 * -0x10 + 8);
      pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
    }
    run_control(local_110);
    iVar1 = option(OPTION_WITHOUT_DEVICE);
    if (iVar1 != 0) {
      simulate_control(odm,spur_00);
    }
    pthread_testcancel();
    control_cycle = dVar6;
  } while( true );
}

Assistant:

void control_loop(void)
{
  OdometryPtr odometry;
  SpurUserParamsPtr spur;

  odometry = get_odometry_ptr();
  spur = get_spur_user_param_ptr();

  yprintf(OUTPUT_LV_INFO, "Trajectory control loop started.\n");
  pthread_cleanup_push(control_loop_cleanup, NULL);

  double last_time = get_time();

#if defined(HAVE_CLOCK_NANOSLEEP)  // clock_nanosleepが利用可能
  struct timespec request;

  if (clock_gettime(CLOCK_MONOTONIC, &request) == -1)
  {
    yprintf(OUTPUT_LV_ERROR, "Error on clock_gettime\n");
    static int status = EXIT_FAILURE;
    pthread_exit(&status);
  }
  double last_monotonic_time = request.tv_sec + request.tv_nsec / 1000000000.0;
#endif  // defined(HAVE_CLOCK_NANOSLEEP)
  while (1)
  {
    const double control_cycle = p(YP_PARAM_CONTROL_CYCLE, 0);

#if defined(HAVE_CLOCK_NANOSLEEP)  // clock_nanosleepが利用可能
    request.tv_nsec += control_cycle * 1000000000;
    request.tv_sec += request.tv_nsec / 1000000000;
    request.tv_nsec = request.tv_nsec % 1000000000;

    clock_nanosleep(CLOCK_MONOTONIC, TIMER_ABSTIME, &request, 0);

    struct timespec current;
    if (clock_gettime(CLOCK_MONOTONIC, &current) == -1)
    {
      yprintf(OUTPUT_LV_ERROR, "Error on clock_gettime\n");
      static int status = EXIT_FAILURE;
      pthread_exit(&status);
    }
    const double current_monotonic_time = current.tv_sec + current.tv_nsec / 1000000000.0;
    const double expected_dt = current_monotonic_time - last_monotonic_time;
    last_monotonic_time = current_monotonic_time;
#else
    yp_usleep(control_cycle * 1000000);

    const double expected_dt = control_cycle;
#endif  // defined(HAVE_CLOCK_NANOSLEEP)

    if ((option(OPTION_EXIT_ON_TIME_JUMP)))
    {
      const double now = get_time();
      const double dt = now - last_time;
      const double dt_error = dt - expected_dt;
      last_time = now;
      if (dt < 0)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "Detected system time jump back, monotonic time diff: %0.5fs, system time diff: %0.5fs\n",
            expected_dt, dt);
        static int status = EXIT_FAILURE;
        pthread_exit(&status);
      }
      if (dt_error < -p(YP_PARAM_MAX_TIME_JUMP_NEG, 0) || p(YP_PARAM_MAX_TIME_JUMP, 0) < dt_error)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "Detected system time jump: %0.5fs, monotonic time diff: %0.5fs, system time diff: %0.5fs\n",
            dt_error, expected_dt, dt);
        static int status = EXIT_FAILURE;
        pthread_exit(&status);
      }
    }

    coordinate_synchronize(odometry, spur);
    run_control(*odometry, spur);

    if ((option(OPTION_WITHOUT_DEVICE)))
    {
      simulate_control(odometry, spur);
    }

    // スレッドの停止要求チェック
    pthread_testcancel();
  }
  pthread_cleanup_pop(1);
}